

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall deqp::egl::GLES2ThreadTest::DeleteBuffer::exec(DeleteBuffer *this,Thread *t)

{
  ostream *poVar1;
  deUint32 err;
  Thread *pTVar2;
  GLuint buffer;
  GLuint local_1b4;
  undefined1 local_1b0 [136];
  ios_base local_128 [264];
  
  pTVar2 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar2 != (Thread *)0x0) {
    local_1b4 = ((this->m_buffer).m_ptr)->buffer;
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    poVar1 = (ostream *)(local_1b0 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- glDeleteBuffers(1, { ",0x1e)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," })",3);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    (**(code **)(*(long *)&pTVar2[1].super_Thread.m_attribs + 0x438))(1,&local_1b4);
    err = (**(code **)(*(long *)&pTVar2[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"deleteBuffers(1, &buffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x4c8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x18),"End -- glDeleteBuffers()",0x18);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    ((this->m_buffer).m_ptr)->buffer = 0;
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void DeleteBuffer::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	GLuint buffer = m_buffer->buffer;

	thread.newMessage() << "Begin -- glDeleteBuffers(1, { " << buffer << " })" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, deleteBuffers(1, &buffer));
	thread.newMessage() << "End -- glDeleteBuffers()" << tcu::ThreadUtil::Message::End;

	m_buffer->buffer = 0;
}